

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O0

bool __thiscall
ddd::DictionarySGL<false,_false>::insert_key
          (DictionarySGL<false,_false> *this,char *key,uint32_t value)

{
  uint32_t in_EDX;
  char *in_RSI;
  Query *in_RDI;
  Query query;
  DaTrie<false,_false,_false> *this_00;
  uint32_t local_1c;
  byte local_1;
  
  this_00 = (DaTrie<false,_false,_false> *)&stack0xffffffffffffffc8;
  local_1c = in_EDX;
  Query::Query((Query *)this_00,in_RSI);
  Query::set_value((Query *)this_00,local_1c);
  std::
  unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  ::operator->((unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                *)0x14e2ac);
  local_1 = DaTrie<false,_false,_false>::insert_key(this_00,in_RDI);
  if ((bool)local_1) {
    *(long *)&in_RDI->node_pos_ = *(long *)&in_RDI->node_pos_ + 1;
  }
  Query::~Query((Query *)&stack0xffffffffffffffc8);
  return (bool)(local_1 & 1);
}

Assistant:

bool insert_key(const char* key, uint32_t value) {
    assert((value >> 31) == 0);

    Query query(key);
    query.set_value(value);
    if (!trie_->insert_key(query)) {
      return false;
    }
    ++num_keys_;
    return true;
  }